

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void __thiscall Network::printLastResult(Network *this)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < this->layers[this->layerCount - 1]->nodeCount; uVar2 = uVar2 + 1) {
    std::operator<<((ostream *)&std::cout,"Prediction: ");
    poVar1 = std::ostream::_M_insert<double>(this->layers[this->layerCount - 1]->neurons[uVar2]);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void Network::printLastResult() {
	for (size_t i = 0; i < layers[layerCount - 1]->nodeCount; i++) {
		std::cout << "Prediction: " << layers[layerCount - 1]->neurons[i] << std::endl;
	}
}